

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall dlib::error::error(error *this,error_type t,string *a)

{
  string *in_RDX;
  undefined4 in_ESI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__error_0038d048;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RDX);
  *(undefined4 *)(in_RDI + 0x28) = in_ESI;
  return;
}

Assistant:

error(
            error_type t,
            const std::string& a
        ): info(a), type(t) {}